

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O2

CodeLocation __thiscall soul::CodeLocation::getStartOfPreviousLine(CodeLocation *this)

{
  SourceCodeText *pSVar1;
  UTF8Reader extraout_RDX;
  RefCountedPtr<soul::SourceCodeText> *in_RSI;
  CodeLocation CVar2;
  CodeLocation l;
  CodeLocation local_30;
  
  getStartOfLine(&local_30);
  if (local_30.location.data != (char *)0x0) {
    pSVar1 = RefCountedPtr<soul::SourceCodeText>::operator->(in_RSI);
    if ((pSVar1->utf8).data < local_30.location.data) {
      UTF8Reader::operator--(&local_30.location);
      getStartOfLine(this);
      goto LAB_0020e61a;
    }
  }
  (this->sourceCode).object = (SourceCodeText *)0x0;
  (this->location).data = (char *)0x0;
LAB_0020e61a:
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_30.sourceCode);
  CVar2.location.data = extraout_RDX.data;
  CVar2.sourceCode.object = (SourceCodeText *)this;
  return CVar2;
}

Assistant:

CodeLocation CodeLocation::getStartOfPreviousLine() const
{
    auto l = getStartOfLine();

    if (l.location.getAddress() == nullptr)
        return {};

    if (l.location <= sourceCode->utf8)
        return {};

    --(l.location);
    return l.getStartOfLine();
}